

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall cppcms::application::~application(application *this)

{
  _data *p_Var1;
  size_type sVar2;
  reference ppaVar3;
  noncopyable *in_RDI;
  uint i;
  _data *in_stack_ffffffffffffffc0;
  uint local_c;
  
  *(undefined ***)in_RDI = &PTR__application_0052b830;
  local_c = 0;
  while( true ) {
    p_Var1 = booster::hold_ptr<cppcms::application::_data>::operator->
                       ((hold_ptr<cppcms::application::_data> *)(in_RDI + 8));
    sVar2 = std::vector<cppcms::application_*,_std::allocator<cppcms::application_*>_>::size
                      (&p_Var1->managed_children);
    if (sVar2 <= local_c) break;
    p_Var1 = booster::hold_ptr<cppcms::application::_data>::operator->
                       ((hold_ptr<cppcms::application::_data> *)(in_RDI + 8));
    ppaVar3 = std::vector<cppcms::application_*,_std::allocator<cppcms::application_*>_>::operator[]
                        (&p_Var1->managed_children,(ulong)local_c);
    if (*ppaVar3 != (value_type)0x0) {
      (*(*ppaVar3)->_vptr_application[1])();
    }
    in_stack_ffffffffffffffc0 =
         booster::hold_ptr<cppcms::application::_data>::operator->
                   ((hold_ptr<cppcms::application::_data> *)(in_RDI + 8));
    ppaVar3 = std::vector<cppcms::application_*,_std::allocator<cppcms::application_*>_>::operator[]
                        (&in_stack_ffffffffffffffc0->managed_children,(ulong)local_c);
    *ppaVar3 = (value_type)0x0;
    local_c = local_c + 1;
  }
  booster::atomic_counter::~atomic_counter((atomic_counter *)(in_RDI + 0x20));
  booster::hold_ptr<cppcms::application::_data>::~hold_ptr
            ((hold_ptr<cppcms::application::_data> *)in_stack_ffffffffffffffc0);
  booster::noncopyable::~noncopyable(in_RDI);
  return;
}

Assistant:

application::~application()
{
	for(unsigned i=0;i<d->managed_children.size();i++) {
		delete d->managed_children[i];
		d->managed_children[i]=0;
	}
}